

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::
basicSubobjectAtIndex_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int subobjectIndex,int arraySize)

{
  size_type *psVar1;
  undefined8 uVar2;
  bool bVar3;
  long lVar4;
  undefined8 *puVar5;
  long *plVar6;
  bool bVar7;
  int iVar8;
  long *plVar9;
  ulong *puVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  BasicTypeIterator basicIt;
  byte local_2ce;
  int local_2cc;
  ulong *local_2b8;
  long local_2b0;
  ulong local_2a8 [2];
  long *local_298;
  undefined8 local_290;
  long local_288;
  undefined8 uStack_280;
  ulong *local_278;
  long local_270;
  ulong local_268;
  long lStack_260;
  int local_254;
  ulong *local_250;
  long local_248;
  ulong local_240 [2];
  ulong *local_230;
  long local_228;
  ulong local_220 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_210;
  VarType *local_208;
  long *local_200;
  long local_1f8;
  long local_1f0;
  long lStack_1e8;
  long local_1e0;
  SubTypeIterator<glu::IsBasicType> local_1d8;
  TypeAccessFormat local_1b8;
  SubTypeIterator<glu::IsBasicType> local_1a8 [3];
  ios_base local_138 [264];
  
  local_254 = arraySize;
  if (0 < arraySize) {
    local_210 = &__return_storage_ptr__->field_2;
    iVar12 = 0;
    local_2cc = 0;
    bVar7 = 0 < arraySize;
    do {
      local_2ce = bVar7;
      lVar4 = *(long *)((long)this + 0x48);
      iVar8 = (int)((ulong)(*(long *)((long)this + 0x50) - lVar4) >> 3) * -0x49249249;
      bVar7 = 0 < iVar8;
      if (0 < iVar8) {
        lVar14 = 0;
        do {
          local_1e0 = lVar14 * 0x38;
          local_208 = (VarType *)(lVar4 + local_1e0 + 0x20);
          glu::SubTypeIterator<glu::IsBasicType>::SubTypeIterator(&local_1d8,local_208);
          while( true ) {
            local_1a8[0].m_path.
            super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1a8[0].m_path.
            super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_1a8[0].m_type = (VarType *)0x0;
            local_1a8[0].m_path.
            super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            bVar3 = glu::SubTypeIterator<glu::IsBasicType>::operator!=(&local_1d8,local_1a8);
            if (local_1a8[0].m_path.
                super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1a8[0].m_path.
                              super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_1a8[0].m_path.
                                    super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_1a8[0].m_path.
                                    super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (!bVar3) {
              if (local_1d8.m_path.
                  super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1d8.m_path.
                                super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_1d8.m_path.
                                      super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_1d8.m_path.
                                      super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              goto LAB_0145f74a;
            }
            if (subobjectIndex == iVar12) break;
            iVar12 = iVar12 + 1;
            glu::SubTypeIterator<glu::IsBasicType>::operator++(&local_1d8);
          }
          local_2b8 = local_2a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2b8,*(long *)((long)this + 0x28),
                     *(long *)((long)this + 0x30) + *(long *)((long)this + 0x28));
          std::__cxx11::string::append((char *)&local_2b8);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::ostream::operator<<(local_1a8,local_2cc);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          uVar13 = 0xf;
          if (local_2b8 != local_2a8) {
            uVar13 = local_2a8[0];
          }
          if (uVar13 < (ulong)(local_228 + local_2b0)) {
            uVar13 = 0xf;
            if (local_230 != local_220) {
              uVar13 = local_220[0];
            }
            if (uVar13 < (ulong)(local_228 + local_2b0)) goto LAB_0145f3fc;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,(ulong)local_2b8)
            ;
          }
          else {
LAB_0145f3fc:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_230);
          }
          local_298 = &local_288;
          plVar6 = puVar5 + 2;
          if ((long *)*puVar5 == plVar6) {
            local_288 = *plVar6;
            uStack_280 = puVar5[3];
          }
          else {
            local_288 = *plVar6;
            local_298 = (long *)*puVar5;
          }
          local_290 = puVar5[1];
          *puVar5 = plVar6;
          puVar5[1] = 0;
          *(undefined1 *)plVar6 = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
          local_200 = &local_1f0;
          plVar9 = plVar6 + 2;
          if ((long *)*plVar6 == plVar9) {
            local_1f0 = *plVar9;
            lStack_1e8 = plVar6[3];
          }
          else {
            local_1f0 = *plVar9;
            local_200 = (long *)*plVar6;
          }
          local_1f8 = plVar6[1];
          *plVar6 = (long)plVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_200,
                                      *(ulong *)(*(long *)((long)this + 0x48) + local_1e0));
          local_278 = &local_268;
          puVar10 = (ulong *)(plVar6 + 2);
          if ((ulong *)*plVar6 == puVar10) {
            local_268 = *puVar10;
            lStack_260 = plVar6[3];
          }
          else {
            local_268 = *puVar10;
            local_278 = (ulong *)*plVar6;
          }
          local_270 = plVar6[1];
          *plVar6 = (long)puVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          local_1b8.type = local_208;
          local_1b8.path = &local_1d8.m_path;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          glu::operator<<((ostream *)local_1a8,&local_1b8);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          uVar13 = 0xf;
          if (local_278 != &local_268) {
            uVar13 = local_268;
          }
          if (uVar13 < (ulong)(local_248 + local_270)) {
            uVar13 = 0xf;
            if (local_250 != local_240) {
              uVar13 = local_240[0];
            }
            if (uVar13 < (ulong)(local_248 + local_270)) goto LAB_0145f5f8;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_278)
            ;
          }
          else {
LAB_0145f5f8:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_250);
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_210;
          psVar1 = puVar5 + 2;
          if ((size_type *)*puVar5 == psVar1) {
            uVar2 = puVar5[3];
            local_210->_M_allocated_capacity = *psVar1;
            *(undefined8 *)((long)local_210 + 8) = uVar2;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
          }
          __return_storage_ptr__->_M_string_length = puVar5[1];
          *puVar5 = psVar1;
          puVar5[1] = 0;
          *(undefined1 *)psVar1 = 0;
          if (local_250 != local_240) {
            operator_delete(local_250,local_240[0] + 1);
          }
          if (local_278 != &local_268) {
            operator_delete(local_278,local_268 + 1);
          }
          if (local_200 != &local_1f0) {
            operator_delete(local_200,local_1f0 + 1);
          }
          if (local_298 != &local_288) {
            operator_delete(local_298,local_288 + 1);
          }
          if (local_230 != local_220) {
            operator_delete(local_230,local_220[0] + 1);
          }
          if (local_2b8 != local_2a8) {
            operator_delete(local_2b8,local_2a8[0] + 1);
          }
          if (local_1d8.m_path.
              super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1d8.m_path.
                            super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_1d8.m_path.
                                  super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1d8.m_path.
                                  super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          iVar12 = subobjectIndex;
          if (bVar3) break;
LAB_0145f74a:
          lVar14 = lVar14 + 1;
          lVar4 = *(long *)((long)this + 0x48);
          lVar11 = (long)((int)((ulong)(*(long *)((long)this + 0x50) - lVar4) >> 3) * -0x49249249);
          bVar7 = lVar14 < lVar11;
        } while (lVar14 < lVar11);
      }
      if (bVar7) goto LAB_0145f7b6;
      local_2cc = local_2cc + 1;
      bVar7 = local_2cc < local_254;
    } while (local_2cc != local_254);
  }
  do {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__throw_logic_error("basic_string::_M_construct null not valid");
LAB_0145f7b6:
  } while ((local_2ce & 1) == 0);
  return __return_storage_ptr__;
}

Assistant:

string UserDefinedIOCase::IOBlock::basicSubobjectAtIndex (int subobjectIndex, int arraySize) const
{
	int currentIndex = 0;
	for (int arrayNdx = 0; arrayNdx < arraySize; arrayNdx++)
	{
		for (int memberNdx = 0; memberNdx < (int)m_members.size(); memberNdx++)
		{
			const glu::VarType& membType = m_members[memberNdx].type;
			for (glu::BasicTypeIterator basicIt = glu::BasicTypeIterator::begin(&membType);
				 basicIt != glu::BasicTypeIterator::end(&membType);
				 ++basicIt)
			{
				if (currentIndex == subobjectIndex)
					return m_interfaceName + "[" + de::toString(arrayNdx) + "]." + m_members[memberNdx].name + de::toString(glu::TypeAccessFormat(membType, basicIt.getPath()));
				currentIndex++;
			}
		}
	}
	DE_ASSERT(false);
	return DE_NULL;
}